

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# passes.hpp
# Opt level: O1

Program __thiscall Pass1::run(Pass1 *this,Program *program)

{
  Function *pFVar1;
  Type *pTVar2;
  mapped_type pFVar3;
  mapped_type *ppFVar4;
  Function *extraout_RDX;
  Program PVar5;
  FunctionTableKey new_key;
  FunctionTable function_table;
  FileTable file_table;
  key_type local_a0;
  _Rb_tree<Pass1::FunctionTableKey,_std::pair<const_Pass1::FunctionTableKey,_Function_*>,_std::_Select1st<std::pair<const_Pass1::FunctionTableKey,_Function_*>_>,_std::less<Pass1::FunctionTableKey>,_std::allocator<std::pair<const_Pass1::FunctionTableKey,_Function_*>_>_>
  local_80;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Function_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Function_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Function_*>_>_>
  local_50;
  
  pFVar1 = program->first;
  (this->super_Visitor<const_Expression_*>)._vptr_Visitor = (_func_int **)0x0;
  this->old_program = (Program *)0x0;
  local_50._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_50._M_impl.super__Rb_tree_header._M_header;
  local_50._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_50._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_50._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_80._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_80._M_impl.super__Rb_tree_header._M_header;
  local_80._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_80._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_80._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_a0.argument_types.super__Vector_base<const_Type_*,_std::allocator<const_Type_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a0.argument_types.super__Vector_base<const_Type_*,_std::allocator<const_Type_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a0.argument_types.super__Vector_base<const_Type_*,_std::allocator<const_Type_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a0.old_function = pFVar1;
  local_80._M_impl.super__Rb_tree_header._M_header._M_right =
       local_80._M_impl.super__Rb_tree_header._M_header._M_left;
  local_50._M_impl.super__Rb_tree_header._M_header._M_right =
       local_50._M_impl.super__Rb_tree_header._M_header._M_left;
  pFVar3 = (mapped_type)operator_new(0x60);
  pTVar2 = pFVar1->return_type;
  (pFVar3->path)._M_dataplus._M_p = (pointer)&(pFVar3->path).field_2;
  (pFVar3->path)._M_string_length = 0;
  (pFVar3->path).field_2._M_local_buf[0] = '\0';
  (pFVar3->block).first = (Expression *)0x0;
  (pFVar3->block).last = (Expression *)0x0;
  pFVar3->arguments = 0;
  (pFVar3->argument_types).super__Vector_base<const_Type_*,_std::allocator<const_Type_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pFVar3->argument_types).super__Vector_base<const_Type_*,_std::allocator<const_Type_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pFVar3->argument_types).super__Vector_base<const_Type_*,_std::allocator<const_Type_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pFVar3->return_type = pTVar2;
  pFVar3->next_function = (Function *)0x0;
  if ((this->super_Visitor<const_Expression_*>)._vptr_Visitor == (_func_int **)0x0) {
    (this->super_Visitor<const_Expression_*>)._vptr_Visitor = (_func_int **)pFVar3;
  }
  if (this->old_program != (Program *)0x0) {
    this->old_program[5].last = pFVar3;
  }
  this->old_program = (Program *)pFVar3;
  ppFVar4 = std::
            map<Pass1::FunctionTableKey,_Function_*,_std::less<Pass1::FunctionTableKey>,_std::allocator<std::pair<const_Pass1::FunctionTableKey,_Function_*>_>_>
            ::operator[]((map<Pass1::FunctionTableKey,_Function_*,_std::less<Pass1::FunctionTableKey>,_std::allocator<std::pair<const_Pass1::FunctionTableKey,_Function_*>_>_>
                          *)&local_80,&local_a0);
  *ppFVar4 = pFVar3;
  evaluate(program,(Program *)this,(FileTable *)&local_50,(FunctionTable *)&local_80,&local_a0,
           &pFVar3->block,&(local_a0.old_function)->block);
  if (local_a0.argument_types.super__Vector_base<const_Type_*,_std::allocator<const_Type_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a0.argument_types.
                    super__Vector_base<const_Type_*,_std::allocator<const_Type_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a0.argument_types.
                          super__Vector_base<const_Type_*,_std::allocator<const_Type_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_a0.argument_types.
                          super__Vector_base<const_Type_*,_std::allocator<const_Type_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<Pass1::FunctionTableKey,_std::pair<const_Pass1::FunctionTableKey,_Function_*>,_std::_Select1st<std::pair<const_Pass1::FunctionTableKey,_Function_*>_>,_std::less<Pass1::FunctionTableKey>,_std::allocator<std::pair<const_Pass1::FunctionTableKey,_Function_*>_>_>
  ::~_Rb_tree(&local_80);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Function_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Function_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Function_*>_>_>
  ::~_Rb_tree(&local_50);
  PVar5.last = extraout_RDX;
  PVar5.first = (Function *)this;
  return PVar5;
}

Assistant:

static Program run(Program& program) {
		const Function* main_function = program.get_main_function();
		Program new_program;
		FileTable file_table;
		FunctionTable function_table;
		FunctionTableKey new_key(main_function);
		Function* new_function = new Function(main_function->get_return_type());
		new_program.add_function(new_function);
		function_table[new_key] = new_function;
		evaluate(&program, &new_program, file_table, function_table, new_key, new_function->get_block(), new_key.old_function->get_block());
		return new_program;
	}